

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData
          (MessageGenerator *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  NewOpRequirements NVar3;
  undefined8 *puVar4;
  char *pcVar5;
  anon_class_1_0_00000001_for_cb *value;
  anon_class_1_0_00000001_for_cb *value_00;
  string *psVar6;
  char *in_R8;
  long lVar7;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  allocator<char> local_785;
  allocator<char> local_784;
  allocator<char> local_783;
  allocator<char> local_782;
  allocator<char> local_781;
  Printer *p_local;
  _Any_data local_778;
  code *local_768;
  code *pcStack_760;
  undefined1 *local_740;
  undefined8 local_738;
  undefined1 local_730 [8];
  undefined8 uStack_728;
  char *local_720;
  size_type local_718;
  char local_710 [8];
  undefined8 uStack_708;
  char *local_700;
  size_type local_6f8;
  char local_6f0 [8];
  undefined8 uStack_6e8;
  char *local_6e0;
  size_type local_6d8;
  char local_6d0 [8];
  undefined8 uStack_6c8;
  Printer *local_6c0;
  string local_6b8;
  anon_class_16_2_fd512ddd_for_cb_conflict1 custom_vtable_methods;
  anon_class_16_2_fd512ddd_for_cb_conflict1 is_initialized;
  anon_class_16_2_fd512ddd_for_cb_conflict1 on_demand_register_arena_dtor;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  string local_4c0;
  string local_4a0;
  Sub local_480;
  undefined1 local_3c8 [64];
  __index_type local_388;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  bool local_360;
  bool local_318;
  undefined1 local_310 [64];
  __index_type local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  bool local_2a8;
  bool local_260;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  NVar3 = GetNewOp(this,(Printer *)0x0);
  io::Printer::Emit(p,0xd6,
                    "\n    inline void* $nonnull$ $classname$::PlacementNew_(\n        //~\n        const void* $nonnull$, void* $nonnull$ mem,\n        $pb$::Arena* $nullable$ arena) {\n      return ::new (mem) $classname$(arena);\n    }\n  "
                   );
  if (((uint3)NVar3 >> 0x10 & 1) == 0) {
    if (((uint3)NVar3 >> 8 & 1) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"copy_type",(allocator<char> *)&on_demand_register_arena_dtor)
      ;
      pcVar5 = "ZeroInit";
      if (((uint3)NVar3 & 1) != 0) {
        pcVar5 = "CopyInit";
      }
      io::Printer::Sub::Sub<char_const(&)[9]>(&local_480,&local_4c0,(char (*) [9])pcVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"arena_offsets",(allocator<char> *)&is_initialized);
      local_3c8._0_8_ = local_3c8 + 0x10;
      if (local_700 == local_6f0) {
        local_3c8._24_8_ = uStack_6e8;
      }
      else {
        local_3c8._0_8_ = local_700;
      }
      local_3c8._8_8_ = local_6f8;
      local_6f8 = 0;
      local_6f0[0] = '\0';
      local_768 = (code *)0x0;
      pcStack_760 = (code *)0x0;
      local_778 = (_Any_data)ZEXT816(0);
      local_700 = local_6f0;
      puVar4 = (undefined8 *)operator_new(0x18);
      *puVar4 = this;
      puVar4[1] = &p_local;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_778._M_unused._M_object = puVar4;
      pcStack_760 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_768 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3c8 + 0x20),
                 (function<bool_()> *)&local_778);
      std::_Function_base::~_Function_base((_Function_base *)&local_778);
      local_380._M_p = (pointer)&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_360 = false;
      if (local_388 == '\x01') {
        std::__cxx11::string::assign((char *)&local_380);
      }
      local_318 = false;
      in_R8 = 
      "\n              constexpr auto $classname$::InternalNewImpl_() {\n                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),\n                                                          alignof($classname$));\n              }\n            "
      ;
      io::Printer::Emit(p,&local_480,2);
      lVar7 = 0xb8;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_480.key_._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0xb8;
      } while (lVar7 != -0xb8);
      std::__cxx11::string::~string((string *)&local_700);
      psVar6 = &local_4c0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"copy_type",(allocator<char> *)&on_demand_register_arena_dtor)
      ;
      pcVar5 = "ZeroInit";
      if (((uint3)NVar3 & 1) != 0) {
        pcVar5 = "CopyInit";
      }
      io::Printer::Sub::Sub<char_const(&)[9]>(&local_480,&local_4a0,(char (*) [9])pcVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"arena_offsets",(allocator<char> *)&is_initialized);
      local_3c8._0_8_ = local_3c8 + 0x10;
      if (local_6e0 == local_6d0) {
        local_3c8._24_8_ = uStack_6c8;
      }
      else {
        local_3c8._0_8_ = local_6e0;
      }
      local_3c8._8_8_ = local_6d8;
      local_6d8 = 0;
      local_6d0[0] = '\0';
      local_768 = (code *)0x0;
      pcStack_760 = (code *)0x0;
      local_778 = (_Any_data)ZEXT816(0);
      local_6e0 = local_6d0;
      puVar4 = (undefined8 *)operator_new(0x18);
      *puVar4 = this;
      puVar4[1] = &p_local;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_778._M_unused._M_object = puVar4;
      pcStack_760 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_768 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3c8 + 0x20),
                 (function<bool_()> *)&local_778);
      std::_Function_base::~_Function_base((_Function_base *)&local_778);
      local_380._M_p = (pointer)&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_360 = false;
      if (local_388 == '\x01') {
        std::__cxx11::string::assign((char *)&local_380);
      }
      local_318 = false;
      in_R8 = 
      "\n              constexpr auto $classname$::InternalNewImpl_() {\n                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({\n                    $arena_offsets$,\n                });\n                if (arena_bits.has_value()) {\n                  return $pbi$::MessageCreator::$copy_type$(\n                      sizeof($classname$), alignof($classname$), *arena_bits);\n                } else {\n                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                               sizeof($classname$),\n                                               alignof($classname$));\n                }\n              }\n            "
      ;
      io::Printer::Emit(p,&local_480,2);
      lVar7 = 0xb8;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_480.key_._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0xb8;
      } while (lVar7 != -0xb8);
      std::__cxx11::string::~string((string *)&local_6e0);
      psVar6 = &local_4a0;
    }
    std::__cxx11::string::~string((string *)psVar6);
  }
  else {
    io::Printer::Emit(p,0xd7,
                      "\n      constexpr auto $classname$::InternalNewImpl_() {\n        return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                     sizeof($classname$), alignof($classname$));\n      }\n    "
                     );
  }
  pPVar1 = p_local;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"default_instance",&local_785);
  local_778 = (_Any_data)absl::lts_20250127::NullSafeStringView("&");
  DefaultInstanceName_abi_cxx11_
            (&local_6b8,(cpp *)this->descriptor_,(Descriptor *)&this->options_,(Options *)0x0,
             SUB81(in_R8,0));
  on_demand_register_arena_dtor.this = (MessageGenerator *)local_6b8._M_string_length;
  on_demand_register_arena_dtor.p = (Printer **)local_6b8._M_dataplus._M_p;
  is_initialized =
       (anon_class_16_2_fd512ddd_for_cb_conflict1)
       absl::lts_20250127::NullSafeStringView("._instance");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&custom_vtable_methods,(lts_20250127 *)local_778._M_pod_data,
             (AlphaNum *)&on_demand_register_arena_dtor,(AlphaNum *)&is_initialized,
             (AlphaNum *)in_R8);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_480,&local_4f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &custom_vtable_methods);
  vars_00.len_ = 1;
  vars_00.ptr_ = &local_480;
  io::Printer::WithVars(&vars,pPVar1,vars_00);
  io::Printer::Sub::~Sub(&local_480);
  std::__cxx11::string::~string((string *)&custom_vtable_methods);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_4f8);
  is_initialized.p = &p_local;
  is_initialized.this = this;
  custom_vtable_methods.this = this;
  custom_vtable_methods.p = &p_local;
  on_demand_register_arena_dtor.this = this;
  on_demand_register_arena_dtor.p = &p_local;
  bVar2 = HasDescriptorMethods(this->descriptor_->file_,&this->options_);
  pPVar1 = p_local;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"on_demand_register_arena_dtor",(allocator<char> *)&local_6b8);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              (&local_480,&local_518,&on_demand_register_arena_dtor);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_538,"is_initialized",&local_785);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              ((Sub *)local_3c8,&local_538,&is_initialized);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"pin_weak_descriptor",&local_782);
    local_310._0_8_ = local_310 + 0x10;
    if (local_720 == local_710) {
      local_310._24_8_ = uStack_708;
    }
    else {
      local_310._0_8_ = local_720;
    }
    local_6c0 = pPVar1;
    local_310._8_8_ = local_718;
    local_718 = 0;
    local_710[0] = '\0';
    local_768 = (code *)0x0;
    pcStack_760 = (code *)0x0;
    local_778 = (_Any_data)ZEXT816(0);
    local_720 = local_710;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = this;
    puVar4[1] = &p_local;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_778._M_unused._M_object = puVar4;
    pcStack_760 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_768 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_310 + 0x20),
               (function<bool_()> *)&local_778);
    std::_Function_base::~_Function_base((_Function_base *)&local_778);
    local_2c8._M_p = (pointer)&local_2b8;
    local_2c0 = 0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = false;
    if (local_2d0 == '\x01') {
      std::__cxx11::string::assign((char *)&local_2c8);
    }
    local_260 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"custom_vtable_methods",&local_783);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
              (&local_258,&local_558,&custom_vtable_methods);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"v2_data",&local_784);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_1a0,&local_578,value_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"tracker_on_get_metadata",&local_781);
    local_e8 = local_d8;
    if (local_740 == local_730) {
      uStack_d0 = uStack_728;
    }
    else {
      local_e8 = local_740;
    }
    local_e0 = local_738;
    local_738 = 0;
    local_730[0] = 0;
    local_768 = (code *)0x0;
    pcStack_760 = (code *)0x0;
    local_778 = (_Any_data)ZEXT816(0);
    local_740 = local_730;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = this;
    puVar4[1] = &p_local;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_778._M_unused._M_object = puVar4;
    pcStack_760 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_768 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_778);
    std::_Function_base::~_Function_base((_Function_base *)&local_778);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    io::Printer::Emit(local_6c0,&local_480,6,0x779,
                      "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataFull{\n                $pbi$::ClassData{\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    false,\n                    $v2_data$,\n                },\n                &$classname$::kDescriptorMethods,\n                &$desc_table$,\n                $tracker_on_get_metadata$,\n            };\n          }\n\n          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const\n              $pbi$::ClassDataFull $classname$_class_data_ =\n                  $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            $pin_weak_descriptor$;\n            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);\n            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);\n            return $classname$_class_data_.base();\n          }\n        "
                     );
    lVar7 = 0x398;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_480.key_._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0xb8;
    } while (lVar7 != -0xb8);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_538);
    psVar6 = &local_518;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"type_size",(allocator<char> *)&local_6b8);
    local_778._M_unused._M_object =
         (void *)((ulong)*(ushort *)((this->descriptor_->all_names_).payload_ + 2) + 1);
    io::Printer::Sub::Sub<unsigned_long>
              (&local_480,&local_598,(unsigned_long *)local_778._M_pod_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"on_demand_register_arena_dtor",&local_785);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              ((Sub *)local_3c8,&local_5b8,&on_demand_register_arena_dtor);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"is_initialized",&local_782);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              ((Sub *)local_310,&local_5d8,&is_initialized);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f8,"custom_vtable_methods",&local_783);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
              (&local_258,&local_5f8,&custom_vtable_methods);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"v2_data",&local_784);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_1a0,&local_618,value);
    io::Printer::Emit(pPVar1,&local_480,5,0x676,
                      "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataLite<$type_size$>{\n                {\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    true,\n                    $v2_data$,\n                },\n                \"$full_name$\",\n            };\n          }\n\n          PROTOBUF_CONSTINIT\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =\n              $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            return $classname$_class_data_.base();\n          }\n        "
                     );
    lVar7 = 0x2e0;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_480.key_._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0xb8;
    } while (lVar7 != -0xb8);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5b8);
    psVar6 = &local_598;
  }
  std::__cxx11::string::~string((string *)psVar6);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&vars);
  return;
}

Assistant:

void MessageGenerator::GenerateClassData(io::Printer* p) {
  const auto new_op = GetNewOp(nullptr);
  // Always generate PlacementNew_ because we might need it for different
  // reasons. EnableCustomNewFor<T> might be false in this compiler, or the
  // object might be too large for arena seeding.
  // We mark `inline` to avoid library bloat if the function is unused.
  p->Emit(R"cc(
    inline void* $nonnull$ $classname$::PlacementNew_(
        //~
        const void* $nonnull$, void* $nonnull$ mem,
        $pb$::Arena* $nullable$ arena) {
      return ::new (mem) $classname$(arena);
    }
  )cc");
  if (new_op.needs_to_run_constructor) {
    p->Emit(R"cc(
      constexpr auto $classname$::InternalNewImpl_() {
        return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                     sizeof($classname$), alignof($classname$));
      }
    )cc");
  } else if (new_op.needs_arena_seeding) {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({
                    $arena_offsets$,
                });
                if (arena_bits.has_value()) {
                  return $pbi$::MessageCreator::$copy_type$(
                      sizeof($classname$), alignof($classname$), *arena_bits);
                } else {
                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                               sizeof($classname$),
                                               alignof($classname$));
                }
              }
            )cc");
  } else {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),
                                                          alignof($classname$));
              }
            )cc");
  }

  auto vars = p->WithVars(
      {{"default_instance",
        absl::StrCat("&", DefaultInstanceName(descriptor_, options_),
                     "._instance")}});
  const auto on_demand_register_arena_dtor = [&] {
    if (NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand) {
      p->Emit(R"cc(
        $classname$::OnDemandRegisterArenaDtor,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // OnDemandRegisterArenaDtor
      )cc");
    }
  };
  const auto is_initialized = [&] {
    if (NeedsIsInitialized()) {
      p->Emit(R"cc(
        $classname$::IsInitializedImpl,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // IsInitialized
      )cc");
    }
  };
  const auto custom_vtable_methods = [&] {
    if (HasGeneratedMethods(descriptor_->file(), options_) &&
        !IsMapEntryMessage(descriptor_)) {
      p->Emit(R"cc(
        $superclass$::GetClearImpl<$classname$>(), &$classname$::ByteSizeLong,
            &$classname$::_InternalSerialize,
      )cc");
    } else {
      p->Emit(R"cc(
        static_cast<void ($pb$::MessageLite::*)()>(&$classname$::ClearImpl),
            $superclass$::ByteSizeLongImpl, $superclass$::_InternalSerializeImpl
            ,
      )cc");
    }
  };

  const auto emit_v2_data = [&] {
  };

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    const auto pin_weak_descriptor = [&] {
      if (!UsingImplicitWeakDescriptor(descriptor_->file(), options_)) return;

      p->Emit({{"pin", StrongReferenceToType(descriptor_, options_)}},
              R"cc(
                $pin$;
              )cc");

      // For CODE_SIZE types, we need to pin the submessages too.
      // SPEED types will pin them via the TcParse table automatically.
      if (HasGeneratedMethods(descriptor_->file(), options_)) return;
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        auto* field = descriptor_->field(i);
        if (field->type() != field->TYPE_MESSAGE) continue;
        p->Emit(
            {{"pin", StrongReferenceToType(field->message_type(), options_)}},
            R"cc(
              $pin$;
            )cc");
      }
    };
    p->Emit(
        {
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"pin_weak_descriptor", pin_weak_descriptor},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
            {"tracker_on_get_metadata",
             [&] {
               if (HasTracker(descriptor_, options_)) {
                 p->Emit(R"cc(
                   &Impl_::TrackerOnGetMetadata,
                 )cc");
               } else {
                 p->Emit(R"cc(
                   nullptr,  // tracker
                 )cc");
               }
             }},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataFull{
                $pbi$::ClassData{
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    false,
                    $v2_data$,
                },
                &$classname$::kDescriptorMethods,
                &$desc_table$,
                $tracker_on_get_metadata$,
            };
          }

          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const
              $pbi$::ClassDataFull $classname$_class_data_ =
                  $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            $pin_weak_descriptor$;
            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);
            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);
            return $classname$_class_data_.base();
          }
        )cc");
  } else {
    p->Emit(
        {
            {"type_size", descriptor_->full_name().size() + 1},
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataLite<$type_size$>{
                {
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    true,
                    $v2_data$,
                },
                "$full_name$",
            };
          }

          PROTOBUF_CONSTINIT
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =
              $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            return $classname$_class_data_.base();
          }
        )cc");
  }
}